

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_fmgen.cpp
# Opt level: O2

void __thiscall FM::Operator::EGUpdate(Operator *this)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0x200U - this->eg_level_ & 0x3ff;
  if (this->inverted_ == false) {
    uVar2 = this->eg_level_;
  }
  iVar1 = uVar2 + this->tl_out_;
  if (0x3fe < iVar1) {
    iVar1 = 0x3ff;
  }
  this->eg_out_ = iVar1 << 3;
  return;
}

Assistant:

inline void Operator::EGUpdate()
{
#if 1	// libOPNMIDI: experimental SSG-EG
	int level = eg_level_;
	level = (!inverted_) ? level : (512 - level) & 0x3ff;
	eg_out_ = Min(tl_out_ + level, 0x3ff) << (1 + 2);
#else
	if (!ssg_type_)
	{
		eg_out_ = Min(tl_out_ + eg_level_, 0x3ff) << (1 + 2);
	}
	else
	{
		eg_out_ = Min(tl_out_ + eg_level_ * ssg_vector_ + ssg_offset_, 0x3ff) << (1 + 2);
	}
#endif
}